

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

bool __thiscall DListBase<JumpCleanupInfo,_RealCount>::Iterator::Prev(Iterator *this)

{
  DListBase<JumpCleanupInfo,_RealCount> *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<JumpCleanupInfo> *pDVar4;
  Iterator *this_local;
  
  if (this->current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x72,"(current != nullptr)","current != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = this->list;
  pDVar4 = DListNodeBase<JumpCleanupInfo>::Prev(this->current);
  bVar2 = DListBase<JumpCleanupInfo,_RealCount>::IsHead(this_00,pDVar4);
  if (bVar2) {
    this->current = (NodeBase *)0x0;
  }
  else {
    pDVar4 = DListNodeBase<JumpCleanupInfo>::Prev(this->current);
    this->current = pDVar4;
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool Prev()
        {
            Assert(current != nullptr);
            if (list->IsHead(current->Prev()))
            {
                current = nullptr;
                return false;
            }
            current = current->Prev();
            return true;
        }